

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

Int128 __thiscall ClipperLib::Int128::operator*(Int128 *this,Int128 *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  ulong *in_RDX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long extraout_RDX;
  ulong uVar9;
  Int128 IVar10;
  
  uVar1 = rhs->hi;
  if ((uVar1 + 1 < 2) && (uVar2 = *in_RDX, uVar2 + 1 < 2)) {
    this->hi = uVar1;
    uVar3 = rhs->lo;
    this->lo = uVar3;
    if ((long)uVar1 < 0) {
      Negate(this);
      uVar3 = this->lo;
    }
    uVar7 = in_RDX[1];
    this->hi = *in_RDX;
    this->lo = uVar7;
    if (this->hi < 0) {
      Negate(this);
    }
    uVar7 = this->lo & 0xffffffff;
    uVar6 = (ulong)this->lo >> 0x20;
    uVar9 = uVar7 * (uVar3 & 0xffffffff);
    uVar7 = uVar6 * (uVar3 & 0xffffffff) + uVar7 * (uVar3 >> 0x20);
    lVar4 = (uVar7 >> 0x20) + uVar6 * (uVar3 >> 0x20);
    this->hi = lVar4;
    uVar7 = uVar7 << 0x20;
    lVar8 = uVar7 + uVar9;
    this->lo = lVar8;
    if (CARRY8(uVar7,uVar9)) {
      this->hi = lVar4 + 1;
    }
    if ((long)(uVar2 ^ uVar1) < 0) {
      Negate(this);
      lVar8 = extraout_RDX;
    }
    IVar10.lo = lVar8;
    IVar10.hi = (long64)this;
    return IVar10;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Int128 operator*: overflow error";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

Int128 operator * (const Int128 &rhs) const
    {
      if ( !(hi == 0 || hi == -1) || !(rhs.hi == 0 || rhs.hi == -1))
        throw "Int128 operator*: overflow error";
      bool negate = (hi < 0) != (rhs.hi < 0);

      Int128 tmp(*this);
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int1Hi = ulong64(tmp.lo) >> 32;
      ulong64 int1Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      tmp = rhs;
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int2Hi = ulong64(tmp.lo) >> 32;
      ulong64 int2Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      //nb: see comments in clipper.pas
      ulong64 a = int1Hi * int2Hi;
      ulong64 b = int1Lo * int2Lo;
      ulong64 c = int1Hi * int2Lo + int1Lo * int2Hi;

      tmp.hi = long64(a + (c >> 32));
      tmp.lo = long64(c << 32);
      tmp.lo += long64(b);
      if (ulong64(tmp.lo) < b) tmp.hi++;
      if (negate) Negate(tmp);
      return tmp;
    }